

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cVertexAttrib64BitTest.cpp
# Opt level: O2

GLdouble VertexAttrib64Bit::Base::RandomDouble(GLdouble min,GLdouble max)

{
  uint uVar1;
  GLushort GVar2;
  
  uVar1 = (uint)RandomDouble::value;
  GVar2 = 0;
  if (RandomDouble::value < 0x2000) {
    GVar2 = RandomDouble::value + 1;
  }
  RandomDouble::value = GVar2;
  return min + (double)uVar1 * 0.0001220703125 * (max - min);
}

Assistant:

GLdouble Base::RandomDouble(GLdouble min, GLdouble max)
{
	static const glw::GLushort max_value = 0x2000;
	static glw::GLushort	   value	 = 0x1234;

	GLdouble	   fraction = ((GLdouble)value) / ((GLdouble)max_value);
	const GLdouble range	= max - min;

	value = static_cast<glw::GLushort>((max_value <= value) ? 0 : value + 1);

	return min + fraction * range;
}